

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvocationOverWriteCase::
genShaderMainBlock_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  allocator<char> local_397;
  byte local_396;
  byte local_395;
  int local_394;
  string local_390;
  byte local_36f;
  byte local_36e;
  byte local_36d;
  int local_36c;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [8];
  string localID_1;
  undefined1 local_2c0 [4];
  int ndx_2;
  byte local_2a0;
  allocator<char> local_29f;
  byte local_29e;
  byte local_29d;
  int local_29c;
  string local_298;
  byte local_277;
  byte local_276;
  byte local_275;
  int local_274;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  string localID;
  undefined1 local_1c8 [4];
  int ndx_1;
  int local_194;
  undefined1 local_190 [4];
  int ndx;
  ostringstream buf;
  InvocationOverWriteCase *this_local;
  
  buf._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  for (local_194 = 0; local_194 < *(int *)((long)this + 0x90); local_194 = local_194 + 1) {
    if ((*(int *)((long)this + 0x78) == 0) && ((*(byte *)((long)this + 0x7c) & 1) != 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_194);
      std::operator<<(poVar1,")], 456);\n");
    }
    else if ((*(int *)((long)this + 0x78) == 0) && ((*(byte *)((long)this + 0x7c) & 1) == 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_194);
      std::operator<<(poVar1,")] = 456;\n");
    }
    else if ((*(int *)((long)this + 0x78) == 1) && ((*(byte *)((long)this + 0x7c) & 1) != 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_194);
      std::operator<<(poVar1,"), 456);\n");
    }
    else if ((*(int *)((long)this + 0x78) == 1) && ((*(byte *)((long)this + 0x7c) & 1) == 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_194);
      std::operator<<(poVar1,"), ivec4(456, 0, 0, 0));\n");
    }
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_((string *)local_1c8,this);
  std::operator<<((ostream *)local_190,(string *)local_1c8);
  std::__cxx11::string::~string((string *)local_1c8);
  for (localID.field_2._12_4_ = 0; (int)localID.field_2._12_4_ < *(int *)((long)this + 0x90);
      localID.field_2._12_4_ = localID.field_2._12_4_ + 1) {
    local_275 = 0;
    local_276 = 0;
    local_277 = 0;
    local_29d = 0;
    local_29e = 0;
    local_2a0 = 0;
    if ((*(byte *)((long)this + 0x7e) & 1) == 0) {
      std::allocator<char>::allocator();
      local_2a0 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f0,"gl_LocalInvocationID.xy",&local_29f);
    }
    else {
      local_274 = localID.field_2._12_4_ + 4;
      de::toString<int>(&local_270,&local_274);
      local_275 = 1;
      std::operator+(&local_250,"(gl_LocalInvocationID.xy + uvec2(",&local_270);
      local_276 = 1;
      std::operator+(&local_230,&local_250,", ");
      local_277 = 1;
      local_29c = localID.field_2._12_4_ * 3;
      de::toString<int>(&local_298,&local_29c);
      local_29d = 1;
      std::operator+(&local_210,&local_230,&local_298);
      local_29e = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     &local_210,")) % gl_WorkGroupSize.xy");
    }
    if ((local_2a0 & 1) != 0) {
      std::allocator<char>::~allocator(&local_29f);
    }
    if ((local_29e & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_210);
    }
    if ((local_29d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_298);
    }
    if ((local_277 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_230);
    }
    if ((local_276 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_250);
    }
    if ((local_275 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_270);
    }
    if ((*(int *)((long)this + 0x78) == 0) && ((*(byte *)((long)this + 0x7c) & 1) != 0)) {
      poVar1 = std::operator<<((ostream *)local_190,"\tatomicExchange(sb_store.values[getIndex(");
      poVar1 = std::operator<<(poVar1,(string *)local_1f0);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID.field_2._12_4_);
      std::operator<<(poVar1,")], groupNdx);\n");
    }
    else if ((*(int *)((long)this + 0x78) == 0) && ((*(byte *)((long)this + 0x7c) & 1) == 0)) {
      poVar1 = std::operator<<((ostream *)local_190,"\tsb_store.values[getIndex(");
      poVar1 = std::operator<<(poVar1,(string *)local_1f0);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID.field_2._12_4_);
      std::operator<<(poVar1,")] = groupNdx;\n");
    }
    else if ((*(int *)((long)this + 0x78) == 1) && ((*(byte *)((long)this + 0x7c) & 1) != 0)) {
      poVar1 = std::operator<<((ostream *)local_190,"\timageAtomicExchange(u_image, getCoord(");
      poVar1 = std::operator<<(poVar1,(string *)local_1f0);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID.field_2._12_4_);
      std::operator<<(poVar1,"), groupNdx);\n");
    }
    else if ((*(int *)((long)this + 0x78) == 1) && ((*(byte *)((long)this + 0x7c) & 1) == 0)) {
      poVar1 = std::operator<<((ostream *)local_190,"\timageStore(u_image, getCoord(");
      poVar1 = std::operator<<(poVar1,(string *)local_1f0);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID.field_2._12_4_);
      std::operator<<(poVar1,"), ivec4(groupNdx, 0, 0, 0));\n");
    }
    std::__cxx11::string::~string((string *)local_1f0);
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_((string *)local_2c0,this);
  std::operator<<((ostream *)local_190,(string *)local_2c0);
  std::__cxx11::string::~string((string *)local_2c0);
  for (localID_1.field_2._12_4_ = 0; (int)localID_1.field_2._12_4_ < *(int *)((long)this + 0x90);
      localID_1.field_2._12_4_ = localID_1.field_2._12_4_ + 1) {
    local_36d = 0;
    local_36e = 0;
    local_36f = 0;
    local_395 = 0;
    local_396 = 0;
    if ((*(byte *)((long)this + 0x7e) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2e8,"gl_LocalInvocationID.xy",&local_397);
      std::allocator<char>::~allocator(&local_397);
    }
    else {
      local_36c = localID_1.field_2._12_4_ + 1;
      de::toString<int>(&local_368,&local_36c);
      local_36d = 1;
      std::operator+(&local_348,"(gl_LocalInvocationID.xy + uvec2(",&local_368);
      local_36e = 1;
      std::operator+(&local_328,&local_348,", ");
      local_36f = 1;
      local_394 = localID_1.field_2._12_4_ * 2;
      de::toString<int>(&local_390,&local_394);
      local_395 = 1;
      std::operator+(&local_308,&local_328,&local_390);
      local_396 = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                     &local_308,")) % gl_WorkGroupSize.xy");
    }
    if ((local_396 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_308);
    }
    if ((local_395 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_390);
    }
    if ((local_36f & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_328);
    }
    if ((local_36e & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_348);
    }
    if ((local_36d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_368);
    }
    if ((*(int *)((long)this + 0x78) == 0) && ((*(byte *)((long)this + 0x7c) & 1) != 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(");
      poVar1 = std::operator<<(poVar1,(string *)local_2e8);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID_1.field_2._12_4_);
      std::operator<<(poVar1,")], 123) == groupNdx);\n");
    }
    else if ((*(int *)((long)this + 0x78) == 0) && ((*(byte *)((long)this + 0x7c) & 1) == 0)) {
      poVar1 = std::operator<<((ostream *)local_190,"\tallOk = allOk && (sb_store.values[getIndex(")
      ;
      poVar1 = std::operator<<(poVar1,(string *)local_2e8);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID_1.field_2._12_4_);
      std::operator<<(poVar1,")] == groupNdx);\n");
    }
    else if ((*(int *)((long)this + 0x78) == 1) && ((*(byte *)((long)this + 0x7c) & 1) != 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(");
      poVar1 = std::operator<<(poVar1,(string *)local_2e8);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID_1.field_2._12_4_);
      std::operator<<(poVar1,"), 123) == groupNdx);\n");
    }
    else if ((*(int *)((long)this + 0x78) == 1) && ((*(byte *)((long)this + 0x7c) & 1) == 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\tallOk = allOk && (imageLoad(u_image, getCoord(");
      poVar1 = std::operator<<(poVar1,(string *)local_2e8);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID_1.field_2._12_4_);
      std::operator<<(poVar1,")).x == groupNdx);\n");
    }
    std::__cxx11::string::~string((string *)local_2e8);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string InvocationOverWriteCase::genShaderMainBlock (void) const
{
	std::ostringstream buf;

	// write

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")], 456);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")] = 456;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), 456);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), ivec4(456, 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// write over

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		// write another invocation's value or our own value depending on test type
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+4) + ", " + de::toString(3*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(" << localID << ", " << ndx << ")] = groupNdx;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(" << localID << ", " << ndx << "), ivec4(groupNdx, 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// read

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		// check another invocation's value or our own value depending on test type
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+1) + ", " + de::toString(2*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], 123) == groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tallOk = allOk && (sb_store.values[getIndex(" << localID << ", " << ndx << ")] == groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), 123) == groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\tallOk = allOk && (imageLoad(u_image, getCoord(" << localID << ", " << ndx << ")).x == groupNdx);\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	return buf.str();
}